

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::load_block_16_8(jpeg_encoder *this,int x,int c)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  int local_34;
  sample_array_t *psStack_30;
  int i;
  sample_array_t *pDst;
  uint8 *pSrc2;
  uint8 *pSrc1;
  int c_local;
  int x_local;
  jpeg_encoder *this_local;
  
  psStack_30 = this->m_sample_array;
  iVar1 = x * 0x30 + c;
  for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 2) {
    pbVar3 = this->m_mcu_lines[local_34] + iVar1;
    pbVar2 = this->m_mcu_lines[local_34 + 1] + iVar1;
    *psStack_30 = ((int)((uint)*pbVar3 + (uint)pbVar3[3] + (uint)*pbVar2 + (uint)pbVar2[3] + 2) >> 2
                  ) + -0x80;
    psStack_30[1] =
         ((int)((uint)pbVar3[6] + (uint)pbVar3[9] + (uint)pbVar2[6] + (uint)pbVar2[9] + 2) >> 2) +
         -0x80;
    psStack_30[2] =
         ((int)((uint)pbVar3[0xc] + (uint)pbVar3[0xf] + (uint)pbVar2[0xc] + (uint)pbVar2[0xf] + 2)
         >> 2) + -0x80;
    psStack_30[3] =
         ((int)((uint)pbVar3[0x12] + (uint)pbVar3[0x15] + (uint)pbVar2[0x12] + (uint)pbVar2[0x15] +
               2) >> 2) + -0x80;
    psStack_30[4] =
         ((int)((uint)pbVar3[0x18] + (uint)pbVar3[0x1b] + (uint)pbVar2[0x18] + (uint)pbVar2[0x1b] +
               2) >> 2) + -0x80;
    psStack_30[5] =
         ((int)((uint)pbVar3[0x1e] + (uint)pbVar3[0x21] + (uint)pbVar2[0x1e] + (uint)pbVar2[0x21] +
               2) >> 2) + -0x80;
    psStack_30[6] =
         ((int)((uint)pbVar3[0x24] + (uint)pbVar3[0x27] + (uint)pbVar2[0x24] + (uint)pbVar2[0x27] +
               2) >> 2) + -0x80;
    psStack_30[7] =
         ((int)((uint)pbVar3[0x2a] + (uint)pbVar3[0x2d] + (uint)pbVar2[0x2a] + (uint)pbVar2[0x2d] +
               2) >> 2) + -0x80;
    psStack_30 = psStack_30 + 8;
  }
  return;
}

Assistant:

void jpeg_encoder::load_block_16_8(int x, int c)
	{
		uint8* pSrc1, * pSrc2;
		sample_array_t* pDst = m_sample_array;
		x = (x * (16 * 3)) + c;
		for (int i = 0; i < 16; i += 2, pDst += 8)
		{
			pSrc1 = m_mcu_lines[i + 0] + x;
			pSrc2 = m_mcu_lines[i + 1] + x;
			pDst[0] = ((pSrc1[0 * 3] + pSrc1[1 * 3] + pSrc2[0 * 3] + pSrc2[1 * 3] + 2) >> 2) - 128; pDst[1] = ((pSrc1[2 * 3] + pSrc1[3 * 3] + pSrc2[2 * 3] + pSrc2[3 * 3] + 2) >> 2) - 128;
			pDst[2] = ((pSrc1[4 * 3] + pSrc1[5 * 3] + pSrc2[4 * 3] + pSrc2[5 * 3] + 2) >> 2) - 128; pDst[3] = ((pSrc1[6 * 3] + pSrc1[7 * 3] + pSrc2[6 * 3] + pSrc2[7 * 3] + 2) >> 2) - 128;
			pDst[4] = ((pSrc1[8 * 3] + pSrc1[9 * 3] + pSrc2[8 * 3] + pSrc2[9 * 3] + 2) >> 2) - 128; pDst[5] = ((pSrc1[10 * 3] + pSrc1[11 * 3] + pSrc2[10 * 3] + pSrc2[11 * 3] + 2) >> 2) - 128;
			pDst[6] = ((pSrc1[12 * 3] + pSrc1[13 * 3] + pSrc2[12 * 3] + pSrc2[13 * 3] + 2) >> 2) - 128; pDst[7] = ((pSrc1[14 * 3] + pSrc1[15 * 3] + pSrc2[14 * 3] + pSrc2[15 * 3] + 2) >> 2) - 128;
		}
	}